

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O1

void __thiscall
afsm::
state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::lock_and_swap_queue
          (state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,event_queue *queue)

{
  _Elt_pointer ppVar1;
  _Elt_pointer ppVar2;
  _Elt_pointer ppVar3;
  _Map_pointer pppVar4;
  _Elt_pointer ppVar5;
  _Elt_pointer ppVar6;
  _Elt_pointer ppVar7;
  _Map_pointer pppVar8;
  _Map_pointer pppVar9;
  size_t sVar10;
  long lVar11;
  iterator *piVar12;
  event_queue *peVar13;
  
  pppVar9 = (this->queued_events_).
            super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            ._M_impl.super__Deque_impl_data._M_map;
  sVar10 = (this->queued_events_).
           super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size;
  ppVar1 = (this->queued_events_).
           super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar2 = (this->queued_events_).
           super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar3 = (this->queued_events_).
           super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar4 = (this->queued_events_).
            super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar5 = (this->queued_events_).
           super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar6 = (this->queued_events_).
           super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar7 = (this->queued_events_).
           super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_last;
  pppVar8 = (this->queued_events_).
            super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  piVar12 = (iterator *)queue;
  peVar13 = &this->queued_events_;
  for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
    (peVar13->
    super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
    )._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)piVar12->_M_cur;
    piVar12 = (iterator *)&piVar12->_M_first;
    peVar13 = (event_queue *)
              &(peVar13->
               super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
               )._M_impl.super__Deque_impl_data._M_map_size;
  }
  (queue->
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  )._M_impl.super__Deque_impl_data._M_map = pppVar9;
  (queue->
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  )._M_impl.super__Deque_impl_data._M_map_size = sVar10;
  (queue->
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  )._M_impl.super__Deque_impl_data._M_start._M_cur = ppVar1;
  (queue->
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  )._M_impl.super__Deque_impl_data._M_start._M_first = ppVar2;
  (queue->
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  )._M_impl.super__Deque_impl_data._M_start._M_last = ppVar3;
  (queue->
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  )._M_impl.super__Deque_impl_data._M_start._M_node = pppVar4;
  (queue->
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar5;
  (queue->
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar6;
  (queue->
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar7;
  (queue->
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  LOCK();
  (this->queue_size_).super___atomic_base<unsigned_long>._M_i =
       (this->queue_size_).super___atomic_base<unsigned_long>._M_i -
       (((long)ppVar3 - (long)ppVar1 >> 3) * -0x3333333333333333 +
        ((long)ppVar5 - (long)ppVar6 >> 3) * -0x3333333333333333 +
       (((long)pppVar8 - (long)pppVar4 >> 3) + -1 + (ulong)(pppVar8 == (_Map_pointer)0x0)) * 0xc);
  UNLOCK();
  return;
}

Assistant:

void
    lock_and_swap_queue(event_queue& queue)
    {
        lock_guard lock{mutex_};
        ::std::swap(queued_events_, queue);
        queue_size_ -= queue.size();
    }